

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_topic_search(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a1;
  int ret;
  HttpTestListener *local_180;
  HttpTestListener *listener;
  string local_170;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [55];
  allocator<char> local_e9;
  string local_e8 [32];
  Ons *local_c8;
  Ons *ons;
  OnsOnsTopicSearchResponseType resp;
  OnsOnsTopicSearchRequestType req;
  
  aliyun::OnsOnsTopicSearchRequestType::OnsOnsTopicSearchRequestType
            ((OnsOnsTopicSearchRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsTopicSearchResponseType::OnsOnsTopicSearchResponseType
            ((OnsOnsTopicSearchResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"cn-hangzhou",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"my_appid",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"my_secret",&local_149);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_e8,local_120,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_c8 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsTopicSearchResponseType::~OnsOnsTopicSearchResponseType
              ((OnsOnsTopicSearchResponseType *)&ons);
    aliyun::OnsOnsTopicSearchRequestType::~OnsOnsTopicSearchRequestType
              ((OnsOnsTopicSearchRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_c8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_topic_search_response;
  local_180 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a1);
  HttpTestListener::Start(local_180);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=((string *)(req.prevent_cache.field_2._M_local_buf + 8),"Search");
  aliyun::Ons::OnsTopicSearch
            (local_c8,(OnsOnsTopicSearchRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsTopicSearchResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_180);
  pHVar3 = local_180;
  if (local_180 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_180);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_c8;
  if (local_c8 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_c8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_topic_search() {
  OnsOnsTopicSearchRequestType req;
  OnsOnsTopicSearchResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_topic_search_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.search = "Search";
  int ret = ons->OnsTopicSearch(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}